

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atari2600.cpp
# Opt level: O0

void __thiscall
Atari2600::Joystick::Joystick(Joystick *this,Bus *bus,size_t shift,size_t fire_tia_input)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator<Inputs::Joystick::Input> local_a1;
  Input local_a0;
  Input local_90;
  Input local_80;
  Input local_70;
  Input local_60;
  Input *local_50;
  size_type local_48;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_40;
  size_t local_28;
  size_t fire_tia_input_local;
  size_t shift_local;
  Bus *bus_local;
  Joystick *this_local;
  
  local_28 = fire_tia_input;
  fire_tia_input_local = shift;
  shift_local = (size_t)bus;
  bus_local = (Bus *)this;
  Inputs::Joystick::Input::Input(&local_a0,Up,0);
  Inputs::Joystick::Input::Input(&local_90,Down,0);
  Inputs::Joystick::Input::Input(&local_80,Left,0);
  Inputs::Joystick::Input::Input(&local_70,Right,0);
  Inputs::Joystick::Input::Input(&local_60,Fire,0);
  local_48 = 5;
  local_50 = &local_a0;
  std::allocator<Inputs::Joystick::Input>::allocator(&local_a1);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_40,__l,&local_a1);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_40);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector(&local_40)
  ;
  std::allocator<Inputs::Joystick::Input>::~allocator(&local_a1);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__Joystick_00c9d610;
  this->bus_ = (Bus *)shift_local;
  this->shift_ = fire_tia_input_local;
  this->fire_tia_input_ = local_28;
  return;
}

Assistant:

Joystick(Bus *bus, std::size_t shift, std::size_t fire_tia_input) :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}),
			bus_(bus), shift_(shift), fire_tia_input_(fire_tia_input) {}